

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::cpp::FilenameIdentifier
                   (string *__return_storage_ptr__,string *filename)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  uchar *puVar5;
  Hex hex;
  undefined1 local_a0 [12];
  AlphaNum local_90;
  AlphaNum local_60;
  int local_20;
  undefined1 local_19;
  int i;
  string *filename_local;
  string *result;
  
  local_19 = 0;
  _i = filename;
  filename_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_20 = 0; uVar2 = (ulong)local_20, uVar3 = std::__cxx11::string::size(), uVar2 < uVar3;
      local_20 = local_20 + 1) {
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)_i);
    bVar1 = ascii_isalnum(*pcVar4);
    if (bVar1) {
      std::__cxx11::string::operator[]((ulong)_i);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    else {
      strings::AlphaNum::AlphaNum(&local_60,"_");
      puVar5 = (uchar *)std::__cxx11::string::operator[]((ulong)_i);
      strings::Hex::Hex<unsigned_char>((Hex *)local_a0,*puVar5,NO_PAD);
      hex._12_4_ = 0;
      hex.value = local_a0._0_8_;
      hex.spec = local_a0._8_4_;
      strings::AlphaNum::AlphaNum(&local_90,hex);
      StrAppend(__return_storage_ptr__,&local_60,&local_90);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string FilenameIdentifier(const string& filename) {
  string result;
  for (int i = 0; i < filename.size(); i++) {
    if (ascii_isalnum(filename[i])) {
      result.push_back(filename[i]);
    } else {
      // Not alphanumeric.  To avoid any possibility of name conflicts we
      // use the hex code for the character.
      StrAppend(&result, "_", strings::Hex(static_cast<uint8>(filename[i])));
    }
  }
  return result;
}